

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instrumented_benchmark.cpp
# Opt level: O3

void measurepopcnt(uint32_t n,uint32_t iterations,bool verbose)

{
  undefined4 uVar1;
  uint uVar2;
  size_t __i;
  long lVar3;
  undefined7 in_register_00000011;
  uint32_t uVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar7 [16];
  undefined1 extraout_var [56];
  undefined1 auVar9 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar10 [16];
  undefined1 in_ZMM3 [64];
  vector<int,_std::allocator<int>_> evts;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  allresults;
  uniform_int_distribution<int> dis;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> mins;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> results;
  vector<double,_std::allocator<double>_> avg;
  LinuxEvents<0> unified;
  random_device rd;
  mt19937 gen;
  vector<int,_std::allocator<int>_> local_28e8;
  uint32_t local_28c4;
  uint32_t local_28c0;
  undefined4 local_28bc;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_28b8;
  ulong local_28a0;
  param_type local_2898;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_2890;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_2878;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2860;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_2848;
  vector<int,_std::allocator<int>_> local_2830;
  vector<double,_std::allocator<double>_> local_2818;
  LinuxEvents<0> local_2800;
  anon_union_5000_2_650ea050_for_random_device_0 local_2740;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13b8;
  undefined1 auVar8 [64];
  
  local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_2740._M_mt._M_x[0]._0_4_ = 0;
  local_28c0 = iterations;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            (&local_28e8,(iterator)0x0,(int *)&local_2740);
  local_2740._M_mt._M_x[0]._0_4_ = 1;
  if (local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_28e8,
               (iterator)
               local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 1;
    local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 5;
  if (local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_28e8,
               (iterator)
               local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 5;
    local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 2;
  if (local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_28e8,
               (iterator)
               local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 2;
    local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 3;
  if (local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_28e8,
               (iterator)
               local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 3;
    local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_2740._M_mt._M_x[0]._0_4_ = 9;
  if (local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_28e8,
               (iterator)
               local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,(int *)&local_2740);
  }
  else {
    *local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = 9;
    local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector(&local_2830,&local_28e8);
  LinuxEvents<0>::LinuxEvents(&local_2800,&local_2830);
  if (local_2830.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2830.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_28b8.
  super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2878.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2878.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2878.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28b8.
  super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28b8.
  super__Vector_base<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::resize
            (&local_2878,
             (long)local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start >> 2);
  std::random_device::random_device((random_device *)&local_2740.field_0);
  local_28bc = (undefined4)CONCAT71(in_register_00000011,verbose);
  uVar2 = std::random_device::_M_getval();
  auVar9 = in_ZMM2._0_16_;
  auVar10 = in_ZMM3._0_16_;
  auVar8._8_56_ = extraout_var;
  auVar8._0_8_ = extraout_XMM1_Qa;
  auVar7 = auVar8._0_16_;
  lVar3 = 1;
  local_13b8._M_x[0] = (unsigned_long)uVar2;
  uVar5 = local_13b8._M_x[0];
  do {
    uVar5 = (ulong)(((uint)(uVar5 >> 0x1e) ^ (uint)uVar5) * 0x6c078965 + (int)lVar3);
    local_13b8._M_x[lVar3] = uVar5;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  local_13b8._M_p = 0x270;
  local_2898._M_a = 0;
  local_2898._M_b = 0xffff;
  local_28c4 = n;
  local_28a0 = (ulong)n;
  if (local_28c0 != 0) {
    uVar4 = 0;
    do {
      uVar5 = local_28a0;
      if (local_28c4 != 0) {
        do {
          std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_2898,&local_13b8,&local_2898);
          uVar5 = uVar5 - 1;
        } while (uVar5 != 0);
      }
      LinuxEvents<0>::start(&local_2800);
      LinuxEvents<0>::end(&local_2800,&local_2878);
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::push_back(&local_28b8,&local_2878);
      auVar9 = in_ZMM2._0_16_;
      auVar7 = auVar8._0_16_;
      auVar10 = in_ZMM3._0_16_;
      uVar4 = uVar4 + 1;
    } while (uVar4 != local_28c0);
  }
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::vector(&local_2848,&local_28b8);
  compute_mins(&local_2890,&local_2848);
  uVar1 = local_28bc;
  uVar4 = local_28c4;
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector(&local_2848);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::vector(&local_2860,&local_28b8);
  compute_averages(&local_2818,&local_2860);
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector(&local_2860);
  printf("%-40s\t","avx512popcnt");
  if ((char)uVar1 == '\0') {
    auVar10 = vcvtusi2sd_avx512f(auVar7,*(undefined8 *)
                                         (undefined1 *)
                                         local_2890.
                                         super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
    auVar7 = vcvtusi2sd_avx512f(auVar7,uVar4 & 0xffffffe0);
    auVar9 = vcvtusi2sd_avx512f(auVar9,*(undefined8 *)
                                        (*(undefined1 (*) [16])
                                          ((long)local_2890.
                                                 super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                                 ._M_impl.super__Vector_impl_data._M_start + 0x20) +
                                        8));
    printf("cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n",
           auVar10._0_8_ / auVar7._0_8_,auVar9._0_8_ / auVar7._0_8_);
  }
  else {
    auVar6 = vcvtuqq2pd_avx512vl(*(undefined1 (*) [16])
                                  local_2890.
                                  super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
    auVar7 = vshufpd_avx(auVar6,auVar6,1);
    auVar9 = vcvtusi2sd_avx512f(auVar10,uVar4 & 0xffffffe0);
    printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, instructions per 16-bit word %4.3f \n"
           ,auVar7._0_8_ / auVar6._0_8_,auVar6._0_8_ / auVar9._0_8_,auVar7._0_8_ / auVar9._0_8_);
    printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu cache ref., %8llu cache mis.\n"
           ,*(undefined8 *)
             (undefined1 *)
             local_2890.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
             _M_impl.super__Vector_impl_data._M_start,
           *(undefined8 *)
            ((undefined1 *)
             local_2890.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
             _M_impl.super__Vector_impl_data._M_start + 8),
           *(undefined8 *)
            *(undefined1 (*) [16])
             ((long)local_2890.
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 0x10),
           *(undefined8 *)
            (*(undefined1 (*) [16])
              ((long)local_2890.
                     super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                     _M_impl.super__Vector_impl_data._M_start + 0x10) + 8),
           *(undefined8 *)
            *(undefined1 (*) [16])
             ((long)local_2890.
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 0x20));
    printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f cache ref., %8.1f cache mis.\n"
           ,*local_2818.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
           local_2818.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[1],
           local_2818.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[2],
           local_2818.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[3],
           local_2818.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[4]);
  }
  if (local_2818.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(local_2818.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((undefined1 (*) [16])
      local_2890.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
      .super__Vector_impl_data._M_start != (undefined1 (*) [16])0x0) {
    operator_delete(local_2890.
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::random_device::_M_fini();
  std::
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  ::~vector(&local_28b8);
  if (local_2878.super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2878.
                    super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  LinuxEvents<0>::~LinuxEvents(&local_2800);
  if (local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28e8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void measurepopcnt(uint32_t n, uint32_t iterations, bool verbose) {
    std::vector<int> evts;
    uint16_t* vdata = (uint16_t*)memory_allocate(n * sizeof(uint16_t));
    std::unique_ptr<uint16_t, decltype(&free)> dataholder(vdata, free);
    evts.push_back(PERF_COUNT_HW_CPU_CYCLES);
    evts.push_back(PERF_COUNT_HW_INSTRUCTIONS);
    evts.push_back(PERF_COUNT_HW_BRANCH_MISSES);
    evts.push_back(PERF_COUNT_HW_CACHE_REFERENCES);
    evts.push_back(PERF_COUNT_HW_CACHE_MISSES);
    evts.push_back(PERF_COUNT_HW_REF_CPU_CYCLES);
    LinuxEvents<PERF_TYPE_HARDWARE> unified(evts);
    std::vector<unsigned long long> results; // tmp buffer
    std::vector< std::vector<unsigned long long> > allresults;
    results.resize(evts.size());
    
    std::random_device rd;
    std::mt19937 gen(rd());
    std::uniform_int_distribution<> dis(0, 0xFFFF);

    for (uint32_t i = 0; i < iterations; i++) {
        for (size_t k = 0; k < n; k++) {
            vdata[k] = dis(gen); // random init.
        }
#if POSPOPCNT_SIMD_VERSION >= 6        
        uint64_t expected = popcnt_harley_seal((const __m512i*) vdata, n / (512 / 16));
        unified.start();
        uint64_t measured = popcnt_harley_seal((const __m512i*) vdata, n / (512 / 16));
        unified.end(results);
#elif POSPOPCNT_SIMD_VERSION >= 5
        uint64_t expected = popcnt_avx2((const __m256i*) vdata, n / (256 / 16));
        unified.start();
        uint64_t measured = popcnt_avx2((const __m256i*) vdata, n / (256 / 16));
        unified.end(results);
#endif
        assert(measured == expected);
        allresults.push_back(results);
    }

#if POSPOPCNT_SIMD_VERSION >= 6    
    n = n / (512 / 16) * (512 / 16);
#elif POSPOPCNT_SIMD_VERSION >= 5
    n = n / (256 / 16) * (256 / 16);
#endif

    std::vector<unsigned long long> mins = compute_mins(allresults);
    std::vector<double> avg = compute_averages(allresults);
#if POSPOPCNT_SIMD_VERSION >= 6 
    printf("%-40s\t","avx512popcnt");    
#elif POSPOPCNT_SIMD_VERSION >= 5
    printf("%-40s\t","avx256popcnt");  
#endif
    if (verbose) {
        printf("instructions per cycle %4.2f, cycles per 16-bit word:  %4.3f, "
               "instructions per 16-bit word %4.3f \n",
                double(mins[1]) / mins[0], double(mins[0]) / n, double(mins[1]) / n);
        // first we display mins
        printf("min: %8llu cycles, %8llu instructions, \t%8llu branch mis., %8llu "
               "cache ref., %8llu cache mis.\n",
                mins[0], mins[1], mins[2], mins[3], mins[4]);
        printf("avg: %8.1f cycles, %8.1f instructions, \t%8.1f branch mis., %8.1f "
               "cache ref., %8.1f cache mis.\n",
                avg[0], avg[1], avg[2], avg[3], avg[4]);
    } else {
        printf("cycles per 16-bit word:  %4.3f; ref cycles per 16-bit word: %4.3f \n", double(mins[0]) / n, double(mins[5]) / n);
    }
}